

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lib1513.c
# Opt level: O2

int test(char *URL)

{
  int iVar1;
  undefined8 uVar2;
  long lVar3;
  undefined8 uVar4;
  undefined8 uStack_20;
  
  iVar1 = curl_global_init(3);
  uVar4 = _stderr;
  if (iVar1 != 0) {
    uVar2 = curl_easy_strerror(iVar1);
    curl_mfprintf(uVar4,"%s:%d curl_global_init() failed, with code %d (%s)\n",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/pelya[P]curl/tests/libtest/lib1513.c"
                  ,0x35,iVar1,uVar2);
    return iVar1;
  }
  lVar3 = curl_easy_init();
  if (lVar3 == 0) {
    curl_mfprintf(_stderr,"%s:%d curl_easy_init() failed\n",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/pelya[P]curl/tests/libtest/lib1513.c"
                  ,0x37);
    iVar1 = 0x7c;
  }
  else {
    iVar1 = curl_easy_setopt(lVar3,0x2712,URL);
    uVar4 = _stderr;
    if (iVar1 == 0) {
      iVar1 = curl_easy_setopt(lVar3,0xd,7);
      uVar4 = _stderr;
      if (iVar1 == 0) {
        iVar1 = curl_easy_setopt(lVar3,99,1);
        uVar4 = _stderr;
        if (iVar1 == 0) {
          iVar1 = curl_easy_setopt(lVar3,0x4e58,progressKiller);
          uVar4 = _stderr;
          if (iVar1 == 0) {
            iVar1 = curl_easy_setopt(lVar3,0x2749,0);
            uVar4 = _stderr;
            if (iVar1 == 0) {
              iVar1 = curl_easy_setopt(lVar3,0x2b,0);
              uVar4 = _stderr;
              if (iVar1 == 0) {
                iVar1 = curl_easy_perform(lVar3);
                goto LAB_00102405;
              }
              uVar2 = curl_easy_strerror(iVar1);
              uStack_20 = 0x3e;
            }
            else {
              uVar2 = curl_easy_strerror(iVar1);
              uStack_20 = 0x3d;
            }
          }
          else {
            uVar2 = curl_easy_strerror(iVar1);
            uStack_20 = 0x3c;
          }
        }
        else {
          uVar2 = curl_easy_strerror(iVar1);
          uStack_20 = 0x3b;
        }
      }
      else {
        uVar2 = curl_easy_strerror(iVar1);
        uStack_20 = 0x3a;
      }
    }
    else {
      uVar2 = curl_easy_strerror(iVar1);
      uStack_20 = 0x39;
    }
    curl_mfprintf(uVar4,"%s:%d curl_easy_setopt() failed, with code %d (%s)\n",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/pelya[P]curl/tests/libtest/lib1513.c"
                  ,uStack_20,iVar1,uVar2);
  }
LAB_00102405:
  curl_easy_cleanup(lVar3);
  curl_global_cleanup();
  return iVar1;
}

Assistant:

int test(char *URL)
{
  CURL *curl;
  int res=0;

  global_init(CURL_GLOBAL_ALL);

  easy_init(curl);

  easy_setopt(curl, CURLOPT_URL, URL);
  easy_setopt(curl, CURLOPT_TIMEOUT, (long)7);
  easy_setopt(curl, CURLOPT_NOSIGNAL, (long)1);
  easy_setopt(curl, CURLOPT_PROGRESSFUNCTION, progressKiller);
  easy_setopt(curl, CURLOPT_PROGRESSDATA, NULL);
  easy_setopt(curl, CURLOPT_NOPROGRESS, (long)0);

  res = curl_easy_perform(curl);

test_cleanup:

  /* undocumented cleanup sequence - type UA */

  curl_easy_cleanup(curl);
  curl_global_cleanup();

  return res;
}